

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

Bounds3f * __thiscall pbrt::Disk::Bounds(Bounds3f *__return_storage_ptr__,Disk *this)

{
  Transform *this_00;
  undefined1 auVar1 [16];
  Point3<float> local_48;
  Point3<float> local_3c;
  Bounds3<float> local_30;
  
  local_48.super_Tuple3<pbrt::Point3,_float>.x = this->radius;
  local_48.super_Tuple3<pbrt::Point3,_float>.z = this->height;
  this_00 = this->renderFromObject;
  auVar1._8_4_ = 0x80000000;
  auVar1._0_8_ = 0x8000000080000000;
  auVar1._12_4_ = 0x80000000;
  auVar1 = vxorps_avx512vl(ZEXT416((uint)local_48.super_Tuple3<pbrt::Point3,_float>.x),auVar1);
  local_3c.super_Tuple3<pbrt::Point3,_float>.x = auVar1._0_4_;
  local_48.super_Tuple3<pbrt::Point3,_float>.y = local_48.super_Tuple3<pbrt::Point3,_float>.x;
  local_3c.super_Tuple3<pbrt::Point3,_float>.y = local_3c.super_Tuple3<pbrt::Point3,_float>.x;
  local_3c.super_Tuple3<pbrt::Point3,_float>.z = local_48.super_Tuple3<pbrt::Point3,_float>.z;
  Bounds3<float>::Bounds3(&local_30,&local_3c,&local_48);
  Transform::operator()(__return_storage_ptr__,this_00,&local_30);
  return __return_storage_ptr__;
}

Assistant:

Bounds3f Disk::Bounds() const {
    return (*renderFromObject)(
        Bounds3f(Point3f(-radius, -radius, height), Point3f(radius, radius, height)));
}